

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O3

Guard * createGuard(GuardType type)

{
  Guard *pGVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  AI AVar5;
  
  pGVar1 = (Guard *)malloc(0x18);
  pGVar1->type = (char)type;
  pGVar1->position = -1;
  if ((int)type < 0x50) {
    switch(type) {
    case CYBORG:
      uVar2 = 0xc;
      uVar3 = 8;
      uVar4 = 2;
      AVar5 = PROX;
      break;
    case DOGS:
      uVar2 = 4;
      uVar3 = 4;
      uVar4 = 6;
      AVar5 = AOE;
      break;
    default:
switchD_0010441d_caseD_45:
      quit("Creating unsupported unit type.");
      return pGVar1;
    case GUARD:
      uVar2 = 5;
      uVar3 = 2;
      uVar4 = 4;
      AVar5 = PROX;
      break;
    case LUNCH:
      uVar2 = 0;
      uVar3 = 6;
      uVar4 = 0xc;
      AVar5 = AOE;
    }
  }
  else if (type == PSYCH) {
    uVar2 = 0;
    uVar3 = 6;
    uVar4 = 0xc;
    AVar5 = PROX;
  }
  else if (type == SHARP) {
    uVar2 = 6;
    uVar3 = 10;
    uVar4 = 8;
    AVar5 = END;
  }
  else {
    if (type != WARDEN) goto switchD_0010441d_caseD_45;
    uVar2 = 100;
    uVar3 = 8;
    uVar4 = 2;
    AVar5 = PROX;
  }
  pGVar1->damage = uVar2;
  pGVar1->range = uVar3;
  pGVar1->cooldown = uVar4;
  pGVar1->ai = AVar5;
  return pGVar1;
}

Assistant:

struct Guard *createGuard(enum GuardType type) {

    struct Guard *guard = malloc(sizeof(struct Guard));

    guard->type = type;
    guard->position = -1;

    switch (type) {

        case GUARD:
            guard->damage = 5;
            guard->range = 2;
            guard->cooldown = 4;
            guard->ai = PROX;
            break;

        case DOGS:
            guard->damage = 4;
            guard->range = 4;
            guard->cooldown = 6;
            guard->ai = AOE;
            break;

        case LUNCH:
            guard->damage = 0;
            guard->range = 6;
            guard->cooldown = 12;
            guard->ai = AOE;
            break;

        case PSYCH:
            guard->damage = 0;
            guard->range = 6;
            guard->cooldown = 12;
            guard->ai = PROX;
            break;

        case SHARP:
            guard->damage = 6;
            guard->range = 10;
            guard->cooldown = 8;
            guard->ai = END;
            break;

        case WARDEN:
            guard->damage = 100;
            guard->range = 8;
            guard->cooldown = 2;
            guard->ai = PROX;
            break;

        case CYBORG:
            guard->damage = 12;
            guard->range = 8;
            guard->cooldown = 2;
            guard->ai = PROX;
            break;

        default:
            quit("Creating unsupported unit type.");
            break;
    }

    return guard;
}